

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O3

bool __thiscall chatra::Thread::initializeVars(Thread *this)

{
  __atomic_flag_data_type _Var1;
  pointer pFVar2;
  pointer ppVar3;
  pointer ppTVar4;
  TemporaryObject *argsValue;
  pointer pFVar5;
  ObjectBase *pOVar6;
  _func_int **pp_Var7;
  Class *cl;
  Reference RVar8;
  NativeMethod *pNVar9;
  pthread_t pVar10;
  Method *pMVar11;
  TemporaryObject *pTVar12;
  Tuple **ppTVar13;
  size_t sVar14;
  __normal_iterator<const_chatra::Class_*const_*,_std::vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>_>
  __tmp;
  _func_int *p_Var15;
  int local_68 [6];
  Node *local_50 [4];
  
  pFVar2 = (this->frames).super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>._M_impl.
           super__Vector_impl_data._M_finish;
  ppVar3 = pFVar2[-1].stack.
           super__Vector_base<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar3[-1].second == 0) {
    ppVar3[-1].second = 1;
    Lock::prepareToMethodCall(pFVar2[-1].lock);
    pFVar2 = (this->frames).super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pp_Var7 = ((pFVar2[-4].values.
                super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1]->targetRef).node)->object[1].
              _vptr_Object;
    RVar8 = Frame::getSelf(pFVar2 + -2);
    p_Var15 = pp_Var7[8];
    if (p_Var15 != pp_Var7[7]) {
      do {
        cl = *(Class **)(p_Var15 + -8);
        p_Var15 = p_Var15 + -8;
        local_50[0] = (Node *)popValueNode;
        local_68[0] = 0;
        std::
        vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
        ::emplace_back<chatra::Node*,int>
                  ((vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
                    *)&(this->frames).
                       super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>._M_impl.
                       super__Vector_impl_data._M_finish[-1].stack,local_50,local_68);
        constructFrames(this,cl->package,cl->node,cl,RVar8);
      } while (p_Var15 != pp_Var7[7]);
    }
    checkTransferReq(this);
    RuntimeImp::enqueue(this->runtime,this);
  }
  else {
    pFVar2[-1].stack.
    super__Vector_base<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar3 + -1;
    pFVar2 = (this->frames).super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    ppTVar4 = pFVar2[-4].values.
              super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    argsValue = ppTVar4[-3];
    pTVar12 = ppTVar4[-2];
    pFVar5 = (this->frames).super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>.
             _M_impl.super__Vector_impl_data._M_start;
    RVar8 = Frame::getSelf(pFVar2 + -2);
    pOVar6 = (ObjectBase *)(RVar8.node)->object;
    pNVar9 = TemporaryObject::getNativeMethod(pTVar12);
    if (pNVar9 == (NativeMethod *)0x0) {
      pMVar11 = TemporaryObject::getRefMethod(pTVar12);
      importMethodArguments(this,pMVar11,argsValue,(TemporaryObject *)0x0);
      return true;
    }
    sVar14 = ((long)pFVar2 - (long)pFVar5 >> 4) * -0xf0f0f0f0f0f0f0f - 4;
    pVar10 = pthread_self();
    (this->nativeCallThreadId)._M_thread = pVar10;
    do {
      LOCK();
      _Var1 = (this->lockNative).flag.super___atomic_flag_base._M_i;
      (this->lockNative).flag.super___atomic_flag_base._M_i = true;
      UNLOCK();
    } while (_Var1 != false);
    pMVar11 = TemporaryObject::getRefMethod(pTVar12);
    pTVar12 = Frame::pushTemporary
                        ((this->frames).
                         super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>._M_impl.
                         super__Vector_impl_data._M_start + sVar14);
    RVar8 = TemporaryObject::setRvalue(pTVar12);
    this->callerFrame = sVar14;
    this->pauseRequested = false;
    if (argsValue == (TemporaryObject *)0x0) {
      ppTVar13 = &this->emptyTuple;
    }
    else {
      ppTVar13 = (Tuple **)&((argsValue->targetRef).node)->object;
    }
    (*pNVar9->method)(pNVar9->handler,this,pOVar6,pMVar11->name,pMVar11->subName,*ppTVar13,
                      (Reference)RVar8.node);
    (this->nativeCallThreadId)._M_thread = 0;
    pop(this);
    if (this->pauseRequested == true) {
      pFVar2 = (this->frames).super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      Lock::prepareToMethodCall(pFVar2[-1].lock);
      checkTransferReq(this);
      if (pFVar2[-1].stack.
          super__Vector_base<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          pFVar2[-1].stack.
          super__Vector_base<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_50[0] = (Node *)restoreTemporaryLockNode;
        local_68[0] = 0;
        std::
        vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
        ::emplace_back<chatra::Node*,int>
                  ((vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
                    *)&pFVar2[-1].stack,local_50,local_68);
      }
    }
    else {
      RuntimeImp::enqueue(this->runtime,this);
    }
    (this->lockNative).flag.super___atomic_flag_base._M_i = false;
  }
  return false;
}

Assistant:

bool Thread::initializeVars() {
	constexpr size_t callFrameCount = 3;
	auto& nodePhase = frames.back().stack.back().second;

	switch (nodePhase) {
	case 0: {
		nodePhase++;
		frames.back().lock->prepareToMethodCall();

		auto& initializationOrder = (frames.end() - callFrameCount - 1)->values.back()->getRef().deref<ObjectBase>().getClass()->refInitializationOrder();
		auto ref = (frames.end() - 2)->getSelf();
		for (auto it = initializationOrder.crbegin(); it != initializationOrder.crend(); it++) {
			auto* cl = *it;
			frames.back().stack.emplace_back(&popValueNode, 0);
			constructFrames(cl->getPackage(), cl->getNode(), cl, ref);
		}

		checkTransferReq();
		runtime.enqueue(this);
		return false;
	}

	default: {
		frames.back().stack.pop_back();
		auto& f0 = *(frames.end() - callFrameCount - 1);
		auto* methodValue = *(f0.values.end() - 2);
		auto* argsValue = *(f0.values.end() - 3);

		auto isNative = invokeNativeMethod(frames.size() - callFrameCount - 1, &(frames.end() - 2)->getSelf().deref<ObjectBase>(),
				methodValue, argsValue, [&]() { pop(); });
		if (isNative)
			return false;

		importMethodArguments(methodValue->getRefMethod(), argsValue);
		return true;
	}
	}
}